

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXR(float **out_rgba,int *width,int *height,char *filename,char **err)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  char **ppcVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  float *pfVar9;
  char *pcVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  float fVar14;
  EXRImage exrImage;
  uint local_10b8;
  uint local_10b4;
  uint local_10b0;
  uint local_10ac;
  EXRImage local_1098;
  
  if (out_rgba == (float **)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar10 = "Invalid argument.\n";
  }
  else {
    local_1098.images = (uchar **)0x0;
    local_1098.pixel_types = (int *)0x0;
    local_1098.num_custom_attributes = 0;
    local_1098.num_channels = 0;
    local_1098.channel_names = (char **)0x0;
    local_1098.requested_pixel_types = (int *)0x0;
    iVar8 = ParseMultiChannelEXRHeaderFromFile(&local_1098,filename,err);
    if (iVar8 != 0) {
      return iVar8;
    }
    if (0 < local_1098.num_channels) {
      lVar11 = 0;
      do {
        if (local_1098.pixel_types[lVar11] == 1) {
          local_1098.requested_pixel_types[lVar11] = 2;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < local_1098.num_channels);
    }
    iVar8 = LoadMultiChannelEXRFromFile(&local_1098,filename,err);
    ppcVar4 = local_1098.channel_names;
    if (iVar8 != 0) {
      return iVar8;
    }
    lVar11 = (long)local_1098.num_channels;
    if (lVar11 < 1) {
      local_10b4 = 0xffffffff;
      local_10b8 = 0xffffffff;
      local_10ac = 0xffffffff;
      local_10b0 = 0xffffffff;
    }
    else {
      local_10b0 = 0xffffffff;
      lVar13 = 0;
      local_10ac = 0xffffffff;
      local_10b8 = 0xffffffff;
      local_10b4 = 0xffffffff;
      do {
        pcVar10 = ppcVar4[lVar13];
        iVar8 = strcmp(pcVar10,"R");
        uVar12 = (uint)lVar13;
        uVar5 = local_10b8;
        uVar6 = uVar12;
        uVar7 = local_10ac;
        if ((((iVar8 != 0) &&
             (iVar8 = strcmp(pcVar10,"G"), uVar5 = uVar12, uVar6 = local_10b4, iVar8 != 0)) &&
            (iVar8 = strcmp(pcVar10,"B"), uVar5 = local_10b8, uVar7 = uVar12, iVar8 != 0)) &&
           (iVar8 = strcmp(pcVar10,"A"), uVar7 = local_10ac, iVar8 == 0)) {
          local_10b0 = uVar12;
        }
        local_10ac = uVar7;
        local_10b4 = uVar6;
        local_10b8 = uVar5;
        lVar13 = lVar13 + 1;
      } while (lVar11 != lVar13);
    }
    if (local_10b4 == 0xffffffff) {
      if (err == (char **)0x0) {
        return -1;
      }
      pcVar10 = "R channel not found\n";
    }
    else if (local_10b8 == 0xffffffff) {
      if (err == (char **)0x0) {
        return -1;
      }
      pcVar10 = "G channel not found\n";
    }
    else {
      if (local_10ac != 0xffffffff) {
        pfVar9 = (float *)malloc((long)local_1098.width * (long)local_1098.height * 0x10);
        *out_rgba = pfVar9;
        if (0 < local_1098.height * local_1098.width) {
          puVar1 = local_1098.images[(int)local_10b4];
          puVar2 = local_1098.images[(int)local_10b8];
          puVar3 = local_1098.images[(int)local_10ac];
          lVar11 = 0;
          do {
            pfVar9[lVar11] = *(float *)(puVar1 + lVar11);
            pfVar9[lVar11 + 1] = *(float *)(puVar2 + lVar11);
            pfVar9[lVar11 + 2] = *(float *)(puVar3 + lVar11);
            fVar14 = 1.0;
            if (0 < (int)local_10b0) {
              fVar14 = *(float *)(local_1098.images[local_10b0] + lVar11);
            }
            pfVar9[lVar11 + 3] = fVar14;
            lVar11 = lVar11 + 4;
          } while ((ulong)(uint)(local_1098.height * local_1098.width) << 2 != lVar11);
        }
        *width = local_1098.width;
        *height = local_1098.height;
        return 0;
      }
      if (err == (char **)0x0) {
        return -1;
      }
      pcVar10 = "B channel not found\n";
    }
  }
  *err = pcVar10;
  return -1;
}

Assistant:

int LoadEXR(float **out_rgba, int *width, int *height, const char *filename,
            const char **err) {

  if (out_rgba == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return -1;
  }

  EXRImage exrImage;
  InitEXRImage(&exrImage);

  {
    int ret = ParseMultiChannelEXRHeaderFromFile(&exrImage, filename, err);
    if (ret != 0) {
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exrImage.num_channels; i++) {
    if (exrImage.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exrImage.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  {
    int ret = LoadMultiChannelEXRFromFile(&exrImage, filename, err);
    if (ret != 0) {
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exrImage.num_channels; c++) {
    if (strcmp(exrImage.channel_names[c], "R") == 0) {
      idxR = c;
    } else if (strcmp(exrImage.channel_names[c], "G") == 0) {
      idxG = c;
    } else if (strcmp(exrImage.channel_names[c], "B") == 0) {
      idxB = c;
    } else if (strcmp(exrImage.channel_names[c], "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exrImage }
    return -1;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  (*out_rgba) =
      (float *)malloc(4 * sizeof(float) * exrImage.width * exrImage.height);
  for (int i = 0; i < exrImage.width * exrImage.height; i++) {
    (*out_rgba)[4 * i + 0] =
        reinterpret_cast<float **>(exrImage.images)[idxR][i];
    (*out_rgba)[4 * i + 1] =
        reinterpret_cast<float **>(exrImage.images)[idxG][i];
    (*out_rgba)[4 * i + 2] =
        reinterpret_cast<float **>(exrImage.images)[idxB][i];
    if (idxA > 0) {
      (*out_rgba)[4 * i + 3] =
          reinterpret_cast<float **>(exrImage.images)[idxA][i];
    } else {
      (*out_rgba)[4 * i + 3] = 1.0;
    }
  }

  (*width) = exrImage.width;
  (*height) = exrImage.height;

  // @todo { free exrImage }
  return 0;
}